

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall Socket_Write_Test::TestBody(Socket_Write_Test *this)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> local_88;
  SocketInterface<socketsys::UnixProvider> local_74;
  undefined1 auStack_70 [4];
  Socket socket;
  thread local_58;
  thread thread;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  ServerSocketInterface<socketsys::UnixServerProvider> local_2c;
  void *pvStack_28;
  ServerSocket server;
  size_t length;
  char *data;
  uint16_t PORT;
  Socket_Write_Test *this_local;
  
  sVar1 = strlen("Hello, World\n");
  pvStack_28 = (void *)(sVar1 + 1);
  socketsys::ServerSocketInterface<socketsys::UnixServerProvider>::ServerSocketInterface
            (&local_2c,IPV4,TCP);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"127.0.0.1");
  sVar1 = 0x14;
  socketsys::ServerSocketInterface<socketsys::UnixServerProvider>::bind
            (&local_2c,(int)&local_40,(sockaddr *)0x697a,0x14);
  _auStack_70 = &local_2c;
  std::thread::thread<Socket_Write_Test::TestBody()::__0,,void>(&local_58,(type *)auStack_70);
  socketsys::SocketInterface<socketsys::UnixProvider>::SocketInterface(&local_74,IPV4,TCP);
  socketsys::SocketInterface<socketsys::UnixProvider>::setSoLinger(&local_74,false,0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"127.0.0.1");
  socketsys::SocketInterface<socketsys::UnixProvider>::connect
            (&local_74,(int)&local_88,(sockaddr *)0x697a,(socklen_t)sVar1);
  socketsys::SocketInterface<socketsys::UnixProvider>::write(&local_74,0x1600af,pvStack_28,sVar1);
  socketsys::SocketInterface<socketsys::UnixProvider>::~SocketInterface(&local_74);
  std::thread::join();
  std::thread::~thread(&local_58);
  socketsys::ServerSocketInterface<socketsys::UnixServerProvider>::~ServerSocketInterface(&local_2c)
  ;
  return;
}

Assistant:

TEST(Socket, Write) {
    constexpr uint16_t PORT = 27002;

    const char* data = "Hello, World\n";
    size_t length = strlen(data) + 1;

    ServerSocket server;
    server.bind("127.0.0.1", PORT);

    std::thread thread([&]() {
        try {
            auto handle = server.accept();
            handle.setSoLinger(false, 0);

            std::vector<char> buffer(length);
            size_t read = handle.read(buffer);
            while (read != length) read += handle.read(buffer);

            EXPECT_TRUE(strcmp(buffer.data(), data) == 0);
        } catch (const std::exception& ex) {
            FAIL() << ex.what() << '\n';
        }
    });

    {
        Socket socket;
        socket.setSoLinger(false, 0);
        socket.connect("127.0.0.1", PORT);
        socket.write(data, length);
    }

    thread.join();
}